

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_x86.h
# Opt level: O0

void load_b_values(int16_t *zbin_ptr,__m128i *zbin,int16_t *round_ptr,__m128i *round,
                  int16_t *quant_ptr,__m128i *quant,int16_t *dequant_ptr,__m128i *dequant,
                  int16_t *shift_ptr,__m128i *shift)

{
  undefined1 auVar1 [16];
  __m128i alVar2;
  longlong lVar3;
  __m128i *quant_local;
  int16_t *quant_ptr_local;
  __m128i *round_local;
  int16_t *round_ptr_local;
  __m128i *zbin_local;
  int16_t *zbin_ptr_local;
  
  lVar3 = *(longlong *)(zbin_ptr + 4);
  (*zbin)[0] = *(longlong *)zbin_ptr;
  (*zbin)[1] = lVar3;
  lVar3 = *(longlong *)(round_ptr + 4);
  (*round)[0] = *(longlong *)round_ptr;
  (*round)[1] = lVar3;
  lVar3 = *(longlong *)(quant_ptr + 4);
  (*quant)[0] = *(longlong *)quant_ptr;
  (*quant)[1] = lVar3;
  auVar1 = vpinsrw_avx(ZEXT216(1),1,1);
  auVar1 = vpinsrw_avx(auVar1,1,2);
  auVar1 = vpinsrw_avx(auVar1,1,3);
  auVar1 = vpinsrw_avx(auVar1,1,4);
  auVar1 = vpinsrw_avx(auVar1,1,5);
  auVar1 = vpinsrw_avx(auVar1,1,6);
  auVar1 = vpinsrw_avx(auVar1,1,7);
  alVar2 = (__m128i)vpsubw_avx((undefined1  [16])*zbin,auVar1);
  *zbin = alVar2;
  lVar3 = *(longlong *)(dequant_ptr + 4);
  (*dequant)[0] = *(longlong *)dequant_ptr;
  (*dequant)[1] = lVar3;
  lVar3 = *(longlong *)(shift_ptr + 4);
  (*shift)[0] = *(longlong *)shift_ptr;
  (*shift)[1] = lVar3;
  return;
}

Assistant:

static inline void load_b_values(const int16_t *zbin_ptr, __m128i *zbin,
                                 const int16_t *round_ptr, __m128i *round,
                                 const int16_t *quant_ptr, __m128i *quant,
                                 const int16_t *dequant_ptr, __m128i *dequant,
                                 const int16_t *shift_ptr, __m128i *shift) {
  *zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  *round = _mm_load_si128((const __m128i *)round_ptr);
  *quant = _mm_load_si128((const __m128i *)quant_ptr);
  *zbin = _mm_sub_epi16(*zbin, _mm_set1_epi16(1));
  *dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  *shift = _mm_load_si128((const __m128i *)shift_ptr);
}